

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testConstructWithHandlerVector_Test::~Engine_testConstructWithHandlerVector_Test
          (Engine_testConstructWithHandlerVector_Test *this)

{
  void *in_RDI;
  
  ~Engine_testConstructWithHandlerVector_Test
            ((Engine_testConstructWithHandlerVector_Test *)0x1300a8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Engine, testConstructWithHandlerVector) {
    std::vector<std::unique_ptr<Handler>> handlers;
    handlers.push_back(std::make_unique<PrintHandler>());
    handlers.push_back(std::make_unique<TestHandler>());
    Engine e("foo", handlers);
    ASSERT_EQ("foo", e.prefix);
    ASSERT_EQ(2, e.GetHandlers().size());
    ASSERT_NE(nullptr, dynamic_cast<PrintHandler *>(e.GetHandlers()[0].get()));
    ASSERT_NE(nullptr, dynamic_cast<TestHandler *>(e.GetHandlers()[1].get()));
}